

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O2

void gai_oper_elem(Integer g_a,Integer *lo,Integer *hi,void *scalar,Integer op)

{
  int *piVar1;
  long *plVar2;
  long *plVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  char *pcVar7;
  Integer IVar8;
  int iVar9;
  undefined4 uVar10;
  logical lVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  double *pdVar22;
  double *pdVar23;
  double *pdVar24;
  bool bVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  double dVar34;
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  char *data_ptr;
  long local_570;
  double *local_568;
  Integer ndim;
  int local_554;
  Integer type;
  Integer local_548;
  Integer *local_540;
  Integer *local_538;
  long local_530;
  Integer loA [7];
  Integer hiA [7];
  Integer ld [7];
  long lStack_470;
  Integer local_468;
  long local_460 [7];
  Integer bunit [7];
  Integer loS [7];
  long local_3a8 [8];
  Integer dims [7];
  _iterator_hdl hdl;
  
  local_568 = (double *)scalar;
  local_540 = lo;
  local_538 = hi;
  pnga_nodeid();
  bVar25 = _ga_sync_begin != 0;
  local_554 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar25) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"gai_oper_elem");
  pnga_inquire(g_a,&type,&ndim,dims);
  pnga_total_blocks(g_a);
  pnga_local_iterator_init(g_a,&hdl);
  pdVar24 = local_568;
  local_548 = op;
  do {
    do {
      iVar9 = pnga_local_iterator_next(&hdl,loA,hiA,&data_ptr,ld);
      if (iVar9 == 0) {
        if (local_554 != 0) {
          pnga_sync();
        }
        return;
      }
      pnga_nnodes();
      lVar18 = 0;
      if (0 < ndim) {
        lVar18 = ndim;
      }
      for (lVar16 = 0; lVar18 != lVar16; lVar16 = lVar16 + 1) {
        loS[lVar16] = loA[lVar16];
      }
      lVar11 = pnga_patch_intersect(local_540,local_538,loA,hiA,ndim);
    } while (lVar11 == 0);
    lVar18 = 0;
    if (0 < ndim) {
      lVar18 = ndim;
    }
    lVar16 = 0;
    do {
      if (lVar18 == lVar16) goto LAB_00115e42;
      plVar3 = loS + lVar16;
      plVar2 = loA + lVar16;
      lVar16 = lVar16 + 1;
    } while (*plVar2 <= *plVar3);
    lVar18 = ndim + -1;
    if (lVar18 < 1) {
      lVar18 = 0;
    }
    lVar16 = 1;
    lVar12 = 0;
    for (lVar20 = 0; lVar18 != lVar20; lVar20 = lVar20 + 1) {
      lVar12 = lVar12 + (loA[lVar20] - loS[lVar20]) * lVar16;
      lVar16 = lVar16 * ld[lVar20];
    }
    if (6 < type - 0x3e9U) {
switchD_00115db6_caseD_3ed:
      pnga_error(" wrong data type ",type);
      goto LAB_00115e42;
    }
    lVar12 = (loA[ndim + -1] - loS[ndim + -1]) * lVar16 + lVar12;
    switch(type) {
    case 0x3e9:
      data_ptr = data_ptr + lVar12 * 4;
      local_570 = 0x3e9;
      break;
    case 0x3ea:
      data_ptr = data_ptr + lVar12 * 8;
      local_570 = 0x3ea;
      break;
    case 0x3eb:
      data_ptr = data_ptr + lVar12 * 4;
      local_570 = 0x3eb;
      break;
    case 0x3ec:
      data_ptr = data_ptr + lVar12 * 8;
      local_570 = 0x3ec;
      break;
    case 0x3ed:
      goto switchD_00115db6_caseD_3ed;
    case 0x3ee:
      lVar12 = lVar12 * 8;
      goto LAB_00115e3d;
    case 0x3ef:
      lVar12 = lVar12 * 0x10;
LAB_00115e3d:
      data_ptr = data_ptr + lVar12;
LAB_00115e42:
      local_570 = type;
    }
    IVar8 = ndim;
    pcVar7 = data_ptr;
    lVar18 = 1;
    lVar16 = lVar18;
    for (; lVar18 < ndim; lVar18 = lVar18 + 1) {
      lVar16 = lVar16 * ((hiA[lVar18] - loA[lVar18]) + 1);
    }
    local_3a8[0] = 0;
    local_3a8[1] = 0;
    bunit[0] = 1;
    bunit[1] = 1;
    local_468 = ld[0];
    local_460[0] = ld[0] * ld[1];
    for (lVar18 = 2; lVar18 < ndim; lVar18 = lVar18 + 1) {
      local_3a8[lVar18] = 0;
      bunit[lVar18] = ((hiA[lVar18 + -1] - loA[lVar18 + -1]) + 1) * bunit[lVar18 + -1];
      (&local_468)[lVar18] = ld[lVar18] * (&lStack_470)[lVar18];
    }
    local_530 = (long)(int)local_570;
    if (lVar16 < 1) {
      lVar16 = 0;
    }
    lVar18 = 0;
    pdVar23 = (double *)0x0;
    while (lVar18 != lVar16) {
      lVar18 = lVar18 + 1;
      lVar20 = 0;
      for (lVar12 = 1; lVar12 < IVar8; lVar12 = lVar12 + 1) {
        lVar20 = lVar20 + (&lStack_470)[lVar12] * local_3a8[lVar12];
        lVar21 = local_3a8[lVar12] + (ulong)(lVar18 % bunit[lVar12] == 0);
        lVar13 = 0;
        if (lVar21 <= hiA[lVar12] - loA[lVar12]) {
          lVar13 = lVar21;
        }
        local_3a8[lVar12] = lVar13;
      }
      if (local_570 - 0x3e9U < 7) {
        pdVar22 = (double *)(pcVar7 + lVar20 * 4);
        switch(local_570) {
        case 0x3e9:
        case 0x3eb:
          break;
        default:
          pdVar22 = (double *)(pcVar7 + lVar20 * 8);
          break;
        case 0x3ed:
          goto switchD_00115fbc_caseD_3ed;
        case 0x3ef:
          pdVar22 = (double *)(pcVar7 + lVar20 * 0x10);
        }
      }
      else {
switchD_00115fbc_caseD_3ed:
        pnga_error("wrong data type.",local_570);
        pdVar22 = pdVar23;
      }
      uVar19 = ((int)hiA[0] - (int)loA[0]) + 1;
      uVar10 = (undefined4)local_570;
      pdVar23 = pdVar22;
      if (op == 2) {
        switch(uVar10) {
        case 0x3e9:
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar15 = 0; pdVar24 = local_568, uVar19 != uVar15; uVar15 = uVar15 + 1) {
            iVar9 = *(int *)((long)pdVar22 + uVar15 * 4);
            if (iVar9 == 0) {
              pnga_error("zero value at index",uVar15);
            }
            else {
              if (2 < iVar9 + 1U) {
                iVar9 = 0;
              }
              *(int *)((long)pdVar22 + uVar15 * 4) = iVar9;
            }
          }
          break;
        case 0x3ea:
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar15 = 0; pdVar24 = local_568, uVar19 != uVar15; uVar15 = uVar15 + 1) {
            dVar14 = pdVar22[uVar15];
            if (dVar14 == 0.0) {
              pnga_error("zero value at index",uVar15);
            }
            else {
              if (2 < (long)dVar14 + 1U) {
                dVar14 = 0.0;
              }
              pdVar22[uVar15] = dVar14;
            }
          }
          break;
        case 0x3eb:
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar15 = 0; pdVar24 = local_568, uVar19 != uVar15; uVar15 = uVar15 + 1) {
            fVar39 = *(float *)((long)pdVar22 + uVar15 * 4);
            if ((fVar39 != 0.0) || (NAN(fVar39))) {
              *(float *)((long)pdVar22 + uVar15 * 4) = 1.0 / fVar39;
            }
            else {
              pnga_error("zero value at index",uVar15);
            }
          }
          break;
        case 0x3ec:
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar15 = 0; pdVar24 = local_568, uVar19 != uVar15; uVar15 = uVar15 + 1) {
            dVar14 = pdVar22[uVar15];
            if ((dVar14 != 0.0) || (NAN(dVar14))) {
              pdVar22[uVar15] = 1.0 / dVar14;
            }
            else {
              pnga_error("zero value at index",uVar15);
            }
          }
          break;
        default:
switchD_00116032_caseD_3ed:
          pnga_error("wrong data type",local_530);
          break;
        case 0x3ee:
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar15 = 0; pdVar24 = local_568, uVar19 != uVar15; uVar15 = uVar15 + 1) {
            fVar39 = SUB84(pdVar22[uVar15],0);
            fVar32 = (float)((ulong)pdVar22[uVar15] >> 0x20);
            uVar26 = -(uint)(-fVar39 <= fVar39);
            uVar28 = -(uint)(-fVar32 <= fVar32);
            uVar27 = CONCAT44(~uVar28 & (uint)-fVar32,~uVar26 & (uint)-fVar39) |
                     CONCAT44((uint)fVar32 & uVar28,(uint)fVar39 & uVar26);
            if ((float)(uVar27 >> 0x20) <= (float)uVar27) {
              if ((fVar39 != 0.0) || (NAN(fVar39))) {
                fVar32 = fVar32 / fVar39;
                fVar31 = 1.0 / ((fVar32 * fVar32 + 1.0) * fVar39);
                *(float *)(pdVar22 + uVar15) = fVar31;
                fVar31 = -fVar32 * fVar31;
                goto LAB_001165c9;
              }
              pnga_error("zero value at index",uVar15);
            }
            else {
              fVar39 = fVar39 / fVar32;
              fVar31 = 1.0 / ((fVar39 * fVar39 + 1.0) * fVar32);
              *(float *)(pdVar22 + uVar15) = fVar39 * fVar31;
              fVar31 = -fVar31;
LAB_001165c9:
              *(float *)((long)pdVar22 + uVar15 * 8 + 4) = fVar31;
            }
          }
          break;
        case 0x3ef:
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar15 = 0; op = local_548, pdVar24 = local_568, uVar19 != uVar15;
              uVar15 = uVar15 + 1) {
            dVar14 = *pdVar22;
            dVar34 = pdVar22[1];
            uVar30 = -(ulong)(-dVar14 <= dVar14);
            uVar29 = -(ulong)(-dVar34 <= dVar34);
            uVar27 = (ulong)dVar34 & uVar29;
            auVar38._0_8_ = ~uVar30 & (ulong)-dVar14;
            auVar38._8_8_ = ~uVar29 & (ulong)-dVar34;
            auVar5._8_4_ = (int)uVar27;
            auVar5._0_8_ = (ulong)dVar14 & uVar30;
            auVar5._12_4_ = (int)(uVar27 >> 0x20);
            if (SUB168(auVar38 | auVar5,8) <= SUB168(auVar38 | auVar5,0)) {
              if ((dVar14 != 0.0) || (NAN(dVar14))) {
                dVar34 = dVar34 / dVar14;
                dVar14 = 1.0 / ((dVar34 * dVar34 + 1.0) * dVar14);
                *pdVar22 = dVar14;
                pdVar22[1] = -dVar34 * dVar14;
              }
              else {
                pnga_error("zero value at index",uVar15);
              }
            }
            else {
              dVar14 = dVar14 / dVar34;
              dVar34 = 1.0 / ((dVar14 * dVar14 + 1.0) * dVar34);
              *pdVar22 = dVar14 * dVar34;
              pdVar22[1] = -dVar34;
            }
            pdVar22 = pdVar22 + 2;
          }
        }
      }
      else if (op == 1) {
        switch(uVar10) {
        case 0x3e9:
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar15 = 0; uVar19 != uVar15; uVar15 = uVar15 + 1) {
            piVar1 = (int *)((long)pdVar22 + uVar15 * 4);
            *piVar1 = *piVar1 + (int)*(float *)pdVar24;
          }
          break;
        case 0x3ea:
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar15 = 0; uVar19 != uVar15; uVar15 = uVar15 + 1) {
            pdVar22[uVar15] = (double)((long)pdVar22[uVar15] + (long)*pdVar24);
          }
          break;
        case 0x3eb:
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar15 = 0; uVar19 != uVar15; uVar15 = uVar15 + 1) {
            *(float *)((long)pdVar22 + uVar15 * 4) =
                 *(float *)pdVar24 + *(float *)((long)pdVar22 + uVar15 * 4);
          }
          break;
        case 0x3ec:
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar15 = 0; uVar19 != uVar15; uVar15 = uVar15 + 1) {
            pdVar22[uVar15] = *pdVar24 + pdVar22[uVar15];
          }
          break;
        default:
          goto switchD_00116032_caseD_3ed;
        case 0x3ee:
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar15 = 0; uVar19 != uVar15; uVar15 = uVar15 + 1) {
            pdVar22[uVar15] =
                 (double)CONCAT44((float)((ulong)pdVar22[uVar15] >> 0x20) +
                                  (float)((ulong)*pdVar24 >> 0x20),
                                  SUB84(pdVar22[uVar15],0) + SUB84(*pdVar24,0));
          }
          break;
        case 0x3ef:
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (lVar12 = 0; (ulong)uVar19 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
            auVar36._0_8_ = *(double *)((long)pdVar22 + lVar12) + *pdVar24;
            auVar36._8_8_ = ((double *)((long)pdVar22 + lVar12))[1] + pdVar24[1];
            *(undefined1 (*) [16])((long)pdVar22 + lVar12) = auVar36;
          }
        }
      }
      else {
        switch(uVar10) {
        case 0x3e9:
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar15 = 0; uVar19 != uVar15; uVar15 = uVar15 + 1) {
            iVar9 = *(int *)((long)pdVar22 + uVar15 * 4);
            iVar17 = -iVar9;
            if (0 < iVar9) {
              iVar17 = iVar9;
            }
            *(int *)((long)pdVar22 + uVar15 * 4) = iVar17;
          }
          break;
        case 0x3ea:
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar15 = 0; uVar19 != uVar15; uVar15 = uVar15 + 1) {
            dVar14 = pdVar22[uVar15];
            dVar34 = (double)-(long)dVar14;
            if (0 < (long)dVar14) {
              dVar34 = dVar14;
            }
            pdVar22[uVar15] = dVar34;
          }
          break;
        case 0x3eb:
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar15 = 0; uVar19 != uVar15; uVar15 = uVar15 + 1) {
            fVar39 = *(float *)((long)pdVar22 + uVar15 * 4);
            uVar26 = -(uint)(fVar39 < -fVar39);
            *(uint *)((long)pdVar22 + uVar15 * 4) = ~uVar26 & (uint)fVar39 | (uint)-fVar39 & uVar26;
          }
          break;
        case 0x3ec:
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar15 = 0; uVar19 != uVar15; uVar15 = uVar15 + 1) {
            dVar14 = pdVar22[uVar15];
            uVar27 = -(ulong)(dVar14 < -dVar14);
            pdVar22[uVar15] = (double)(~uVar27 & (ulong)dVar14 | (ulong)-dVar14 & uVar27);
          }
          break;
        default:
          goto switchD_00116032_caseD_3ed;
        case 0x3ee:
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar15 = 0; uVar19 != uVar15; uVar15 = uVar15 + 1) {
            fVar32 = SUB84(pdVar22[uVar15],0);
            fVar31 = (float)((ulong)pdVar22[uVar15] >> 0x20);
            uVar26 = -(uint)(-fVar32 <= fVar32);
            uVar28 = -(uint)(-fVar31 <= fVar31);
            uVar27 = CONCAT44(~uVar28 & (uint)-fVar31,~uVar26 & (uint)-fVar32) |
                     CONCAT44((uint)fVar31 & uVar28,(uint)fVar32 & uVar26);
            fVar33 = (float)uVar27;
            fVar39 = (float)(uVar27 >> 0x20);
            if (fVar39 <= fVar33) {
              fVar39 = 0.0;
              if ((fVar32 != 0.0) || (NAN(fVar32))) {
                fVar39 = SQRT((fVar31 / fVar32) * (fVar31 / fVar32) + 1.0) * fVar33;
              }
            }
            else {
              fVar39 = SQRT((fVar32 / fVar31) * (fVar32 / fVar31) + 1.0) * fVar39;
            }
            *(float *)(pdVar22 + uVar15) = fVar39;
            *(undefined4 *)((long)pdVar22 + uVar15 * 8 + 4) = 0;
          }
          break;
        case 0x3ef:
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (lVar12 = 0; (ulong)uVar19 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
            dVar34 = *(double *)((long)pdVar22 + lVar12);
            dVar6 = ((double *)((long)pdVar22 + lVar12))[1];
            uVar27 = -(ulong)(-dVar34 <= dVar34);
            uVar30 = -(ulong)(-dVar6 <= dVar6);
            uVar15 = (ulong)dVar6 & uVar30;
            auVar37._0_8_ = ~uVar27 & (ulong)-dVar34;
            auVar37._8_8_ = ~uVar30 & (ulong)-dVar6;
            auVar4._8_4_ = (int)uVar15;
            auVar4._0_8_ = (ulong)dVar34 & uVar27;
            auVar4._12_4_ = (int)(uVar15 >> 0x20);
            dVar35 = SUB168(auVar37 | auVar4,0);
            dVar14 = SUB168(auVar37 | auVar4,8);
            if (dVar14 <= dVar35) {
              dVar14 = 0.0;
              if ((dVar34 != 0.0) || (NAN(dVar34))) {
                dVar14 = SQRT((dVar6 / dVar34) * (dVar6 / dVar34) + 1.0) * dVar35;
              }
            }
            else {
              dVar14 = SQRT((dVar34 / dVar6) * (dVar34 / dVar6) + 1.0) * dVar14;
            }
            *(double *)((long)pdVar22 + lVar12) = dVar14;
            *(undefined8 *)((long)pdVar22 + lVar12 + 8) = 0;
          }
        }
      }
    }
  } while( true );
}

Assistant:

static void gai_oper_elem(Integer g_a, Integer *lo, Integer *hi, void *scalar, Integer op)
{

  Integer ndim, dims[MAXDIM], type;
  Integer loA[MAXDIM], hiA[MAXDIM], ld[MAXDIM];
  char *data_ptr;
  Integer me= pnga_nodeid();
  Integer num_blocks;
  int local_sync_begin,local_sync_end;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle(g_a, "gai_oper_elem");


  pnga_inquire(g_a,  &type, &ndim, dims);
  num_blocks = pnga_total_blocks(g_a);

  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&data_ptr,ld)) {
    Integer offset, i, j, jtmp, chk;
    Integer loS[MAXDIM];
    Integer nproc = pnga_nnodes();

    /* loA is changed by pnga_patch_intersect, so
       save a copy */
    for (j=0; j<ndim; j++) {
      loS[j] = loA[j];
    }
    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){
      /* Check for partial overlap */
      chk = 1;
      for (j=0; j<ndim; j++) {
        if (loS[j] < loA[j]) {
          chk=0;
          break;
        }
      }
      if (!chk) {
        /* Evaluate additional offset for pointer */
        offset = 0;
        jtmp = 1;
        for (j=0; j<ndim-1; j++) {
          offset += (loA[j]-loS[j])*jtmp;
          jtmp *= ld[j];
        }
        offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
        switch (type){
          case C_INT:
            data_ptr = (void*)((int*)data_ptr + offset);
            break;
          case C_DCPL:
            data_ptr = (void*)((double*)data_ptr + 2*offset);
            break;
          case C_SCPL:
            data_ptr = (void*)((float*)data_ptr + 2*offset);
            break;
          case C_DBL:
            data_ptr = (void*)((double*)data_ptr + offset);
            break;
          case C_FLOAT:
            data_ptr = (void*)((float*)data_ptr + offset);
            break;
          case C_LONG:
            data_ptr = (void*)((long*)data_ptr + offset);
            break;
          default: pnga_error(" wrong data type ",type);
        }
      }
      /* perform operation on all elements in local patch */
      ngai_do_oper_elem(type, ndim, loA, hiA, ld, data_ptr, scalar, op);
    }
  }
#if 0
  if (num_blocks < 0) {
    /* get limits of VISIBLE patch */
    pnga_distribution(g_a, me, loA, hiA);

    /* loA is changed by pnga_patch_intersect, so
       save a copy */
    for (j=0; j<ndim; j++) {
      loS[j] = loA[j];
    }

    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

      /* get data_ptr to corner of patch */
      /* ld are leading dimensions INCLUDING ghost cells */
      pnga_access_ptr(g_a, loA, hiA, &data_ptr, ld);

      /* perform operation on all elements in local patch */
      ngai_do_oper_elem(type, ndim, loA, hiA, ld, data_ptr, scalar, op);

      /* release access to the data */
      pnga_release_update(g_a, loA, hiA);
    }
  } else {
    Integer offset, i, j, jtmp, chk;
    Integer loS[MAXDIM];
    Integer nproc = pnga_nnodes();
    /* using simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)){
      for (i=me; i<num_blocks; i += nproc) {

        /* get limits of patch */
        pnga_distribution(g_a, i, loA, hiA); 

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_ptr(g_a, i, &data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                data_ptr = (void*)((int*)data_ptr + offset);
                break;
              case C_DCPL:
                data_ptr = (void*)((double*)data_ptr + 2*offset);
                break;
              case C_SCPL:
                data_ptr = (void*)((float*)data_ptr + 2*offset);
                break;
              case C_DBL:
                data_ptr = (void*)((double*)data_ptr + offset);
                break;
              case C_FLOAT:
                data_ptr = (void*)((float*)data_ptr + offset);
                break;
              case C_LONG:
                data_ptr = (void*)((long*)data_ptr + offset);
                break;
              default: pnga_error(" wrong data type ",type);
            }
          }
          /* perform operation on all elements in local patch */
          ngai_do_oper_elem(type, ndim, loA, hiA, ld, data_ptr, scalar, op);

          /* release access to the data */
          pnga_release_update_block(g_a, i);
        }
      }
    } else {
      /* using scalapack block-cyclic data distribution */
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[ndim-1] < blocks[ndim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < ndim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > dims[i]) hiA[i] = dims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_grid_ptr(g_a, index, &data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                data_ptr = (void*)((int*)data_ptr + offset);
                break;
              case C_DCPL:
                data_ptr = (void*)((double*)data_ptr + 2*offset);
                break;
              case C_SCPL:
                data_ptr = (void*)((float*)data_ptr + 2*offset);
                break;
              case C_DBL:
                data_ptr = (void*)((double*)data_ptr + offset);
                break;
              case C_FLOAT:
                data_ptr = (void*)((float*)data_ptr + offset);
                break;
              case C_LONG:
                data_ptr = (void*)((long*)data_ptr + offset);
                break;
              default: pnga_error(" wrong data type ",type);
            }
          }

          /* perform operation on all elements in local patch */
          ngai_do_oper_elem(type, ndim, loA, hiA, ld, data_ptr, scalar, op);

          /* release access to the data */
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < ndim; i++) {
          if (index[i] >= blocks[i] && i<ndim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();
}